

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall extract_all::extractfs(extract_all *this,string *name,FileContainer_ptr *fs)

{
  element_type *peVar1;
  string fssavepath;
  undefined1 local_98 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Function_base local_40;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &this->_dstpath,"/");
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,name)
  ;
  std::__cxx11::string::~string((string *)local_98);
  CreateDirPath<char>(&local_60);
  peVar1 = (fs->super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98._0_8_ = this;
  std::__shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
             &fs->super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)(local_98 + 0x18),(string *)&local_60);
  std::function<void(std::__cxx11::string_const&)>::
  function<extract_all::extractfs(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_40,
             (anon_class_56_3_659c12bf *)local_98);
  (*peVar1->_vptr_FileContainer[10])(peVar1,&local_40);
  std::_Function_base::~_Function_base(&local_40);
  extractfs(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)::
  {lambda(std::__cxx11::string_const&)#1}::~shared_ptr
            ((_lambda_std____cxx11__string_const___1_ *)local_98);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void extractfs(const std::string& name, FileContainer_ptr fs)
    {
        std::string fssavepath= _dstpath+"/"+name;
        CreateDirPath(fssavepath);
        fs->filename_enumerator(
            [this,fs,fssavepath](const std::string& romname) {
                try {
                    fs->extractfile(romname, fssavepath+"/"+romname, _filter);
                }
                catch(const char*msg)
                {
                    printf("extractfile: %s: %s\n", romname.c_str(), msg);
                }
            }
        );

    }